

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyFraig.c
# Opt level: O3

void Ivy_FraigCreateClasses(Ivy_FraigMan_t *p)

{
  int *piVar1;
  Ivy_Man_t *pIVar2;
  Ivy_Obj_t *pIVar3;
  Ivy_Obj_t *pIVar4;
  void **ppvVar5;
  uint uVar6;
  void *__ptr;
  Ivy_Obj_t *pIVar7;
  Ivy_Obj_t **ppIVar8;
  Vec_Ptr_t *pVVar9;
  int iVar10;
  Ivy_Obj_t *pIVar11;
  long lVar12;
  ulong uVar13;
  uint uVar14;
  ulong uVar15;
  Ivy_Obj_t *pIVar16;
  Ivy_FraigList_t *pIVar17;
  long lVar18;
  
  pIVar2 = p->pManAig;
  pIVar3 = pIVar2->pConst1;
  iVar10 = (pIVar2->nCreated - pIVar2->nDeleted) / 2;
  __ptr = calloc(1,(long)iVar10 * 8 + 0x68);
  pVVar9 = pIVar2->vObjs;
  uVar6 = pVVar9->nSize;
  if (0 < (int)uVar6) {
    lVar18 = 0;
    do {
      pIVar16 = (Ivy_Obj_t *)pVVar9->pArray[lVar18];
      if (((pIVar16 != (Ivy_Obj_t *)0x0) && (uVar6 = *(uint *)&pIVar16->field_0x8 & 0xf, uVar6 < 7))
         && ((0x62U >> uVar6 & 1) != 0)) {
        uVar6 = Ivy_NodeHash(p,pIVar16);
        if (uVar6 == 0) {
          if (0 < (long)p->nSimWords) {
            lVar12 = 0;
            do {
              if (*(int *)((long)&pIVar16->pFanout->pFanout + lVar12 * 4) != 0) goto LAB_007f16ad;
              lVar12 = lVar12 + 1;
            } while (p->nSimWords != lVar12);
          }
          ppIVar8 = &pIVar3->pNextFan1;
          if (pIVar3->pNextFan1 != (Ivy_Obj_t *)0x0) {
            ppIVar8 = &pIVar3->pNextFan0->pNextFan1;
          }
          *ppIVar8 = pIVar16;
          pIVar3->pNextFan0 = pIVar16;
          pIVar16->pNextFan0 = pIVar3;
LAB_007f175a:
          pIVar16->pNextFan1 = (Ivy_Obj_t *)0x0;
        }
        else {
LAB_007f16ad:
          uVar13 = (ulong)uVar6 % (ulong)(iVar10 + 0xd);
          pIVar4 = *(Ivy_Obj_t **)((long)__ptr + uVar13 * 8);
          if (pIVar4 != (Ivy_Obj_t *)0x0) {
            pIVar11 = pIVar4;
            do {
              pIVar7 = pIVar4;
              if (p->nSimWords < 1) {
LAB_007f16fb:
                pIVar4 = pIVar7;
                if (pIVar7->pNextFan1 != (Ivy_Obj_t *)0x0) {
                  pIVar4 = pIVar7->pNextFan0;
                }
                pIVar4->pNextFan1 = pIVar16;
                pIVar7->pNextFan0 = pIVar16;
                pIVar16->pNextFan0 = pIVar7;
                goto LAB_007f175a;
              }
              uVar15 = 0;
              while (*(int *)((long)&pIVar11->pFanout->pFanout + uVar15 * 4) ==
                     *(int *)((long)&pIVar16->pFanout->pFanout + uVar15 * 4)) {
                uVar15 = uVar15 + 1;
                pIVar7 = pIVar11;
                if ((uint)p->nSimWords == uVar15) goto LAB_007f16fb;
              }
              pIVar11 = pIVar11->pPrevFan0;
            } while (pIVar11 != (Ivy_Obj_t *)0x0);
          }
          pIVar16->pPrevFan0 = pIVar4;
          *(Ivy_Obj_t **)((long)__ptr + uVar13 * 8) = pIVar16;
        }
      }
      lVar18 = lVar18 + 1;
      pVVar9 = p->pManAig->vObjs;
      uVar6 = pVVar9->nSize;
    } while (lVar18 < (int)uVar6);
  }
  if ((p->lClasses).pHead != (Ivy_Obj_t *)0x0) {
    __assert_fail("p->lClasses.pHead == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyFraig.c"
                  ,0x4bb,"void Ivy_FraigCreateClasses(Ivy_FraigMan_t *)");
  }
  if (0 < (int)uVar6) {
    ppvVar5 = pVVar9->pArray;
    uVar13 = 0;
    do {
      pIVar3 = (Ivy_Obj_t *)ppvVar5[uVar13];
      if ((pIVar3 != (Ivy_Obj_t *)0x0) &&
         ((pIVar3->Id == 0 ||
          ((uVar14 = *(uint *)&pIVar3->field_0x8 & 0xf, uVar14 < 7 && ((0x62U >> uVar14 & 1) != 0)))
          ))) {
        pIVar3->pPrevFan0 = (Ivy_Obj_t *)0x0;
        if (pIVar3->pNextFan0 == (Ivy_Obj_t *)0x0) {
          if (pIVar3->pNextFan1 != (Ivy_Obj_t *)0x0) {
            __assert_fail("Ivy_ObjClassNodeNext(pObj) == NULL",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyFraig.c"
                          ,0x4c3,"void Ivy_FraigCreateClasses(Ivy_FraigMan_t *)");
          }
        }
        else if (pIVar3->pNextFan0->pNextFan1 == (Ivy_Obj_t *)0x0) {
          pIVar3->pNextFan0 = (Ivy_Obj_t *)0x0;
          if ((p->lClasses).pHead == (Ivy_Obj_t *)0x0) {
            pIVar16 = (Ivy_Obj_t *)0x0;
            pIVar17 = &p->lClasses;
          }
          else {
            pIVar16 = (p->lClasses).pTail;
            pIVar17 = (Ivy_FraigList_t *)&pIVar16->pPrevFan0;
          }
          pIVar17->pHead = pIVar3;
          (p->lClasses).pTail = pIVar3;
          pIVar3->pPrevFan1 = pIVar16;
          pIVar3->pPrevFan0 = (Ivy_Obj_t *)0x0;
          piVar1 = &(p->lClasses).nItems;
          *piVar1 = *piVar1 + 1;
        }
      }
      uVar13 = uVar13 + 1;
    } while (uVar6 != uVar13);
  }
  if (__ptr == (void *)0x0) {
    return;
  }
  free(__ptr);
  return;
}

Assistant:

void Ivy_FraigCreateClasses( Ivy_FraigMan_t * p )
{
    Ivy_Obj_t ** pTable;
    Ivy_Obj_t * pObj, * pConst1, * pBin, * pEntry;
    int i, nTableSize;
    unsigned Hash;
    pConst1 = Ivy_ManConst1(p->pManAig);
    // allocate the table
    nTableSize = Ivy_ManObjNum(p->pManAig) / 2 + 13;
    pTable = ABC_ALLOC( Ivy_Obj_t *, nTableSize ); 
    memset( pTable, 0, sizeof(Ivy_Obj_t *) * nTableSize );
    // collect nodes into the table
    Ivy_ManForEachObj( p->pManAig, pObj, i )
    {
        if ( !Ivy_ObjIsPi(pObj) && !Ivy_ObjIsNode(pObj) )
            continue;
        Hash = Ivy_NodeHash( p, pObj );
        if ( Hash == 0 && Ivy_NodeHasZeroSim( p, pObj ) )
        {
            Ivy_NodeAddToClass( pConst1, pObj );
            continue;
        }
        // add the node to the table
        pBin = pTable[Hash % nTableSize];
        Ivy_FraigForEachBinNode( pBin, pEntry )
            if ( Ivy_NodeCompareSims( p, pEntry, pObj ) )
            {
                Ivy_NodeAddToClass( pEntry, pObj );
                break;
            }
        // check if the entry was added
        if ( pEntry )
            continue;
        Ivy_ObjSetNodeHashNext( pObj, pBin );
        pTable[Hash % nTableSize] = pObj;
    }
    // collect non-trivial classes
    assert( p->lClasses.pHead == NULL );
    Ivy_ManForEachObj( p->pManAig, pObj, i )
    {
        if ( !Ivy_ObjIsConst1(pObj) && !Ivy_ObjIsPi(pObj) && !Ivy_ObjIsNode(pObj) )
            continue;
        Ivy_ObjSetNodeHashNext( pObj, NULL );
        if ( Ivy_ObjClassNodeRepr(pObj) == NULL )
        {
            assert( Ivy_ObjClassNodeNext(pObj) == NULL );
            continue;
        }
        // recognize the head of the class
        if ( Ivy_ObjClassNodeNext( Ivy_ObjClassNodeRepr(pObj) ) != NULL )
            continue;
        // clean the class representative and add it to the list
        Ivy_ObjSetClassNodeRepr( pObj, NULL );
        Ivy_FraigAddClass( &p->lClasses, pObj );
    }
    // free the table
    ABC_FREE( pTable );
}